

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

shared_ptr<wallet::CWallet> __thiscall
wallet::RestoreWallet
          (wallet *this,WalletContext *context,path *backup_file,string *wallet_name,
          optional<bool> load_on_start,DatabaseStatus *status,bilingual_str *error,
          vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  pointer pcVar1;
  string original;
  string original_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar4;
  element_type *peVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffdd8;
  path local_1f8 [2];
  string local_198;
  string local_178 [32];
  bilingual_str local_158;
  path local_118;
  path wallet_file;
  path wallet_path;
  DatabaseOptions options;
  shared_ptr<wallet::CWallet> wallet;
  pointer local_38;
  
  local_38 = *(pointer *)(in_FS_OFFSET + 0x28);
  options.require_existing = false;
  options.require_create = false;
  options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
  super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged = false;
  options.create_flags = 0;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &options.create_passphrase.field_2;
  options.create_passphrase._M_string_length = 0;
  options.create_passphrase.field_2._M_local_buf[0] = '\0';
  options.verify = true;
  options.use_unsafe_sync = false;
  options.use_shared_memory = false;
  options.max_log_mb = 100;
  options.create_passphrase._M_dataplus._M_p = (pointer)args;
  ReadDatabaseArgs(context->args,&options);
  options.require_existing = true;
  GetWalletDir();
  pcVar1 = (wallet_name->_M_dataplus)._M_p;
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xffffffffffffffb8;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)&wallet,pcVar1,pcVar1 + wallet_name->_M_string_length);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)&local_158,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)&wallet,
             auto_format);
  std::filesystem::__cxx11::path::path(&wallet_file.super_path,(path *)&local_158);
  std::filesystem::__cxx11::path::~path((path *)&local_158);
  std::__cxx11::u8string::~u8string((u8string *)&wallet);
  fsbridge::AbsPathJoin(&wallet_path,(path *)local_1f8,(path *)&wallet_file.super_path);
  std::filesystem::__cxx11::path::~path(&wallet_file.super_path);
  std::filesystem::__cxx11::path::~path(local_1f8);
  std::filesystem::__cxx11::path::path(&local_118,&wallet_path.super_path);
  fs::path::operator/=((path *)&local_118,"wallet.dat");
  std::filesystem::__cxx11::path::path(&wallet_file.super_path,&local_118);
  std::filesystem::__cxx11::path::~path(&local_118);
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar5 = (element_type *)this;
  bVar3 = std::filesystem::exists(&backup_file->super_path);
  if (bVar3) {
    bVar3 = std::filesystem::exists(&wallet_path.super_path);
    if (!bVar3) {
      bVar3 = TryCreateDirectories(&wallet_path);
      if (bVar3) {
        std::filesystem::copy_file((path *)backup_file,(path *)&wallet_file,none);
        LoadWallet((wallet *)&local_158,context,wallet_name,load_on_start,&options,status,error,
                   warnings);
        std::__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)&local_158);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_158.original._M_string_length);
        if (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::filesystem::remove_all((path *)&wallet_path);
        }
        _Var2._M_pi = wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage =
             (_func_int **)
             wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (((element_type *)this)->super_Notifications)._vptr_Notifications =
             (_func_int **)_Var2._M_pi;
        wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        goto LAB_00990ed4;
      }
    }
    std::filesystem::__cxx11::path::string(&local_1f8[0]._M_pathname,&wallet_path.super_path);
    tinyformat::format<std::__cxx11::string>
              (&local_198,
               (tinyformat *)"Failed to create database path \'%s\'. Database already exists.",
               (char *)local_1f8,args);
    original_00._M_string_length = (size_type)peVar5;
    original_00._M_dataplus._M_p = (pointer)status;
    original_00.field_2 = in_stack_fffffffffffffdd8;
    Untranslated(&local_158,original_00);
    bilingual_str::operator=(error,&local_158);
    bilingual_str::~bilingual_str(&local_158);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)local_1f8);
    *status = FAILED_ALREADY_EXISTS;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              (local_178,"Backup file does not exist",(allocator<char> *)local_1f8);
    original._M_string_length = (size_type)peVar5;
    original._M_dataplus._M_p = (pointer)status;
    original.field_2 = in_stack_fffffffffffffdd8;
    Untranslated(&local_158,original);
    bilingual_str::operator=(error,&local_158);
    bilingual_str::~bilingual_str(&local_158);
    std::__cxx11::string::~string(local_178);
    *status = FAILED_INVALID_BACKUP_FILE;
  }
  (((element_type *)this)->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
  (((element_type *)this)->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
LAB_00990ed4:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::filesystem::__cxx11::path::~path(&wallet_file.super_path);
  std::filesystem::__cxx11::path::~path(&wallet_path.super_path);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::~basic_string
            (&options.create_passphrase);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38) {
    sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<wallet::CWallet>)
           sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> RestoreWallet(WalletContext& context, const fs::path& backup_file, const std::string& wallet_name, std::optional<bool> load_on_start, DatabaseStatus& status, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    DatabaseOptions options;
    ReadDatabaseArgs(*context.args, options);
    options.require_existing = true;

    const fs::path wallet_path = fsbridge::AbsPathJoin(GetWalletDir(), fs::u8path(wallet_name));
    auto wallet_file = wallet_path / "wallet.dat";
    std::shared_ptr<CWallet> wallet;

    try {
        if (!fs::exists(backup_file)) {
            error = Untranslated("Backup file does not exist");
            status = DatabaseStatus::FAILED_INVALID_BACKUP_FILE;
            return nullptr;
        }

        if (fs::exists(wallet_path) || !TryCreateDirectories(wallet_path)) {
            error = Untranslated(strprintf("Failed to create database path '%s'. Database already exists.", fs::PathToString(wallet_path)));
            status = DatabaseStatus::FAILED_ALREADY_EXISTS;
            return nullptr;
        }

        fs::copy_file(backup_file, wallet_file, fs::copy_options::none);

        wallet = LoadWallet(context, wallet_name, load_on_start, options, status, error, warnings);
    } catch (const std::exception& e) {
        assert(!wallet);
        if (!error.empty()) error += Untranslated("\n");
        error += strprintf(Untranslated("Unexpected exception: %s"), e.what());
    }
    if (!wallet) {
        fs::remove_all(wallet_path);
    }

    return wallet;
}